

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::static_huffman_data_model::clear(static_huffman_data_model *this)

{
  static_huffman_data_model *this_local;
  
  this->m_total_syms = 0;
  vector<unsigned_short>::clear(&this->m_codes);
  vector<unsigned_char>::clear(&this->m_code_sizes);
  if (this->m_pDecode_tables != (decoder_tables *)0x0) {
    crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
    this->m_pDecode_tables = (decoder_tables *)0x0;
  }
  this->m_encoding = false;
  return;
}

Assistant:

void static_huffman_data_model::clear() {
  m_total_syms = 0;
  m_codes.clear();
  m_code_sizes.clear();
  if (m_pDecode_tables) {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }
  m_encoding = false;
}